

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall
dxil_spv::SPIRVModule::Impl::add_instruction
          (Impl *this,Block *bb,
          unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *puVar1;
  Op OVar2;
  Id id_00;
  pointer pIVar3;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_78;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  undefined4 local_54;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50;
  __single_object replaced;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  __single_object is_nan;
  Id null_const;
  Id nan_id;
  Id new_id;
  Id type_id;
  Id id;
  Op op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst_local;
  Block *bb_local;
  Impl *this_local;
  
  _id = inst;
  inst_local = (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)bb;
  bb_local = (Block *)this;
  pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (inst);
  type_id = spv::Instruction::getOpCode(pIVar3);
  pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (inst);
  new_id = spv::Instruction::getResultId(pIVar3);
  pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (inst);
  nan_id = spv::Instruction::getTypeId(pIVar3);
  if ((((new_id == 0) || (((this->instruction_instrumentation).info.enabled & 1U) == 0)) ||
      ((this->instruction_instrumentation).info.type != FlushNaNToZero)) ||
     ((OVar2 = spv::Builder::getTypeClass(&this->builder,nan_id), OVar2 != OpTypeFloat ||
      (type_id == 0xf5)))) {
    puVar1 = inst_local;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_78,inst);
    spv::Block::addInstruction((Block *)puVar1,&local_78);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_78);
    if (((((this->instruction_instrumentation).info.enabled & 1U) != 0) &&
        ((this->instruction_instrumentation).info.type == FullNanInf)) && (type_id != 0xf5)) {
      add_instrumented_instruction(this,type_id,(Block *)inst_local,new_id);
    }
  }
  else {
    id_00 = spv::Builder::getUniqueId(&this->builder);
    is_nan._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (inst);
    spv::Instruction::setResultId(pIVar3,id_00);
    is_nan._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
         spv::Builder::makeNullConstant(&this->builder,nan_id);
    replaced._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::makeBoolType(&this->builder);
    replaced._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x9c;
    std::make_unique<spv::Instruction,unsigned_int&,unsigned_int,spv::Op>
              ((uint *)&local_40,
               (uint *)((long)&is_nan._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               (Op *)((long)&replaced._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4));
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_40);
    spv::Instruction::addIdOperand(pIVar3,id_00);
    local_54 = 0xa9;
    std::make_unique<spv::Instruction,unsigned_int&,unsigned_int&,spv::Op>
              ((uint *)&local_50,&new_id,&nan_id);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_50);
    spv::Instruction::addIdOperand
              (pIVar3,is_nan._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_50);
    spv::Instruction::addIdOperand
              (pIVar3,(Id)is_nan._M_t.
                          super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_50);
    spv::Instruction::addIdOperand(pIVar3,id_00);
    puVar1 = inst_local;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_60,inst);
    spv::Block::addInstruction((Block *)puVar1,&local_60);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_60);
    puVar1 = inst_local;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_68,&local_40);
    spv::Block::addInstruction((Block *)puVar1,&local_68);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_68);
    puVar1 = inst_local;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_70,&local_50);
    spv::Block::addInstruction((Block *)puVar1,&local_70);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_70);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_50);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_40);
  }
  return;
}

Assistant:

void SPIRVModule::Impl::add_instruction(spv::Block *bb, std::unique_ptr<spv::Instruction> inst)
{
	spv::Op op = inst->getOpCode();
	spv::Id id = inst->getResultId();
	spv::Id type_id = inst->getTypeId();

	if (id != 0 && instruction_instrumentation.info.enabled &&
	    instruction_instrumentation.info.type == InstructionInstrumentationType::FlushNaNToZero &&
	    builder.getTypeClass(type_id) == spv::OpTypeFloat && op != spv::OpPhi)
	{
		// A bit special since we're rewriting the IDs.
		spv::Id new_id = builder.getUniqueId();
		spv::Id nan_id = builder.getUniqueId();
		inst->setResultId(new_id);

		spv::Id null_const = builder.makeNullConstant(type_id);
		auto is_nan = std::make_unique<spv::Instruction>(nan_id, builder.makeBoolType(), spv::OpIsNan);
		is_nan->addIdOperand(new_id);
		auto replaced = std::make_unique<spv::Instruction>(id, type_id, spv::OpSelect);
		replaced->addIdOperand(nan_id);
		replaced->addIdOperand(null_const);
		replaced->addIdOperand(new_id);

		bb->addInstruction(std::move(inst));
		bb->addInstruction(std::move(is_nan));
		bb->addInstruction(std::move(replaced));
	}
	else
	{
		bb->addInstruction(std::move(inst));

		// For Full instrumentation add everything, otherwise, we need specialized instrumentation.
		if (instruction_instrumentation.info.enabled &&
		    instruction_instrumentation.info.type == InstructionInstrumentationType::FullNanInf &&
		    op != spv::OpPhi)
		{
			add_instrumented_instruction(op, bb, id);
		}
	}
}